

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

void cnn::TensorTools::Constant(Tensor *d,float c)

{
  float *__s;
  uint uVar1;
  long lVar2;
  
  __s = d->v;
  uVar1 = Dim::size(&d->d);
  if (c != 0.0) {
    for (lVar2 = 0; (ulong)uVar1 << 2 != lVar2; lVar2 = lVar2 + 4) {
      *(float *)((long)__s + lVar2) = c;
    }
    return;
  }
  memset(__s,0,(ulong)uVar1 << 2);
  return;
}

Assistant:

void TensorTools::Constant(Tensor& d, float c) {
#if HAVE_CUDA
  if (!c) {
    CUDA_CHECK(cudaMemsetAsync(d.v, 0, d.d.size() * sizeof(float)));
  } else {
    fill(d.v, d.v + d.d.size(), c);
  }
#else
  if (!c) {
    memset(d.v, c, d.d.size() * sizeof(float));
  } else {
    fill(d.v, d.v + d.d.size(), c);
  }
#endif
}